

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_study.c
# Opt level: O2

int find_minlength(pcre2_real_code_8 *re,PCRE2_SPTR8 code,PCRE2_SPTR8 startcode,BOOL utf,
                  recurse_check *recurses,int *countptr,int *backref_cache)

{
  byte *pbVar1;
  PCRE2_UCHAR8 PVar2;
  PCRE2_UCHAR8 PVar3;
  PCRE2_UCHAR8 PVar4;
  uint uVar5;
  bool bVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  PCRE2_SPTR8 pPVar12;
  byte bVar13;
  long lVar14;
  recurse_check *prVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  uint8_t *puVar19;
  byte *pbVar20;
  byte *pbVar21;
  byte *pbVar22;
  uint uVar23;
  byte *pbVar24;
  long lStackY_c0;
  uint local_a4;
  int local_74;
  uint local_70;
  uint local_6c;
  int local_68;
  uint local_64;
  recurse_check this_recurse;
  
  PVar2 = *code;
  if ((byte)(PVar2 + 0x74) < 5) {
    return 0;
  }
  uVar5 = re->flags;
  PVar3 = code[1];
  PVar4 = code[2];
  iVar10 = *countptr;
  *countptr = iVar10 + 1;
  if (1000 < iVar10) {
LAB_0018f239:
    return -1;
  }
  pbVar21 = code + (ulong)((byte)(PVar2 + 0x77) < 2) * 2 + 3;
  pbVar22 = code + CONCAT11(PVar3,PVar4);
  local_68 = 0;
  local_70 = 0xffffffff;
  local_74 = 0;
  bVar6 = false;
  lStackY_c0 = 0;
  uVar16 = 0;
  local_6c = local_70;
  local_64 = local_70;
LAB_0018f2bd:
  lVar17 = lStackY_c0;
  pbVar24 = pbVar21;
  uVar23 = uVar16;
  if (0xfffe < (int)uVar16) {
    uVar23 = 0xffff;
    pbVar24 = pbVar22;
  }
  uVar11 = (ulong)*pbVar24;
  pbVar21 = pbVar24;
  lStackY_c0 = lVar17;
  uVar16 = uVar23;
  switch(uVar11) {
  case 0:
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
    if (((int)local_64 < 0) || ((!bVar6 && ((int)uVar23 < (int)local_64)))) {
      local_64 = uVar23;
    }
    if (*pbVar24 != 0x78) {
      return local_64;
    }
    if (local_64 == 0) {
      return 0;
    }
    pbVar22 = pbVar24 + (ushort)(*(ushort *)(pbVar24 + 1) << 8 | *(ushort *)(pbVar24 + 1) >> 8);
    pbVar21 = pbVar24 + 3;
    bVar6 = false;
    uVar16 = 0;
    goto LAB_0018f2bd;
  case 1:
  case 2:
  case 4:
  case 5:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x76:
  case 0x7d:
  case 0x7e:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0xa9:
  case 0xaa:
    break;
  case 3:
  case 0x21:
  case 0x22:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x2a:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x37:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x44:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x51:
  case 0x53:
  case 0x54:
  case 0x9b:
  case 0x9d:
  case 0x9f:
  case 0xa1:
  case 0xa3:
  case 0xa6:
    pbVar21 = pbVar24 + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                        [uVar11];
    goto LAB_0018f2bd;
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
    goto switchD_0018f2ea_caseD_6;
  case 0xf:
  case 0x10:
    pbVar24 = pbVar24 + 2;
switchD_0018f2ea_caseD_6:
    pbVar21 = pbVar24 + 1;
    uVar16 = uVar23 + 1;
    goto LAB_0018f2bd;
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x23:
  case 0x24:
  case 0x2b:
  case 0x30:
  case 0x31:
  case 0x38:
  case 0x3d:
  case 0x3e:
  case 0x45:
  case 0x4a:
  case 0x4b:
  case 0x52:
    pbVar21 = pbVar24 + 2;
    uVar16 = uVar23 + 1;
    goto LAB_0018f2bd;
  case 0x29:
  case 0x36:
  case 0x43:
  case 0x50:
    pbVar21 = pbVar24 + 4;
    uVar16 = (ushort)(*(ushort *)(pbVar24 + 1) << 8 | *(ushort *)(pbVar24 + 1) >> 8) + uVar23;
    goto LAB_0018f2bd;
  case 0x55:
  case 0x56:
  case 0x59:
  case 0x5a:
  case 0x5e:
  case 0x60:
    bVar13 = pbVar24[1];
    goto LAB_0018f485;
  case 0x57:
  case 0x58:
  case 0x5f:
    pbVar21 = pbVar24 + (ulong)((byte)(pbVar24[1] - 0xf) < 2) * 2 + 2;
    uVar16 = uVar23 + 1;
    goto LAB_0018f2bd;
  case 0x5b:
  case 0x5c:
  case 0x61:
    bVar13 = pbVar24[3];
LAB_0018f485:
    pbVar24 = pbVar24 + (ulong)((byte)(bVar13 - 0xf) < 2) * 2;
    break;
  case 0x5d:
    pbVar21 = pbVar24 + (ulong)((byte)(pbVar24[3] - 0xf) < 2) * 2 + 4;
    uVar16 = (ushort)(*(ushort *)(pbVar24 + 1) << 8 | *(ushort *)(pbVar24 + 1) >> 8) + uVar23;
    goto LAB_0018f2bd;
  default:
    goto LAB_0018f239;
  case 0x6e:
  case 0x6f:
    pbVar21 = pbVar24 + 0x21;
    uVar16 = pbVar24[0x21] - 0x62;
    if (uVar16 < 0xc) {
      if ((0x533U >> (uVar16 & 0x1f) & 1) == 0) {
        if ((0x20cU >> (uVar16 & 0x1f) & 1) == 0) {
          pbVar21 = pbVar24 + 0x26;
          uVar16 = (ushort)(*(ushort *)(pbVar24 + 0x22) << 8 | *(ushort *)(pbVar24 + 0x22) >> 8) +
                   uVar23;
          goto LAB_0018f2bd;
        }
        uVar23 = uVar23 + 1;
      }
      pbVar21 = pbVar24 + 0x22;
      uVar16 = uVar23;
      goto LAB_0018f2bd;
    }
    uVar16 = uVar23 + 1;
    goto LAB_0018f2bd;
  case 0x71:
  case 0x72:
    uVar7 = *(ushort *)(pbVar24 + 1) << 8 | *(ushort *)(pbVar24 + 1) >> 8;
    uVar11 = (ulong)(uint)uVar7;
    uVar16 = (uint)uVar7;
    if ((uVar16 != *backref_cache && *backref_cache <= (int)(uint)uVar7) ||
       (local_a4 = backref_cache[uVar11], (int)local_a4 < 0)) {
      local_a4 = 0;
      if ((re->overall_options & 0x200) == 0) {
        pbVar20 = coda__pcre2_find_bracket_8(startcode,utf,uVar16);
        pbVar21 = pbVar20;
        if (pbVar20 == (byte *)0x0) {
          return -2;
        }
        do {
          uVar8 = *(ushort *)(pbVar21 + 1) << 8 | *(ushort *)(pbVar21 + 1) >> 8;
          pbVar1 = pbVar21 + uVar8;
          pbVar21 = pbVar21 + uVar8;
        } while (*pbVar1 == 0x78);
        if (((uVar5 >> 0x15 & 1) == 0) ||
           (pPVar12 = coda__pcre2_find_bracket_8(pbVar21,utf,uVar16), pPVar12 == (PCRE2_SPTR8)0x0))
        {
          prVar15 = recurses;
          if ((pbVar20 < pbVar24) && (pbVar24 < pbVar21)) {
LAB_0018f7c3:
            bVar6 = true;
          }
          else {
            for (; prVar15 != (recurse_check *)0x0; prVar15 = prVar15->prev) {
              if (prVar15->group == pbVar20) goto LAB_0018f7c3;
            }
            this_recurse.prev = recurses;
            this_recurse.group = pbVar20;
            local_a4 = find_minlength(re,pbVar20,startcode,utf,&this_recurse,countptr,backref_cache)
            ;
            if ((int)local_a4 < 0) {
              return local_a4;
            }
          }
        }
      }
      backref_cache[uVar11] = local_a4;
      lVar14 = (long)*backref_cache;
      while (lVar14 = lVar14 + 1, lVar14 < (long)uVar11) {
        backref_cache[lVar14] = -1;
      }
      *backref_cache = (uint)uVar7;
    }
    lStackY_c0 = 3;
    goto LAB_0018fa30;
  case 0x73:
  case 0x74:
    lStackY_c0 = 5;
    if (((uVar5 >> 0x15 & 1) == 0) && ((re->overall_options & 0x200) == 0)) {
      puVar19 = re[1].start_bitmap +
                (ulong)re->name_entry_size *
                (ulong)(ushort)(*(ushort *)(pbVar24 + 1) << 8 | *(ushort *)(pbVar24 + 1) >> 8) +
                -0x28;
      local_a4 = 0x7fffffff;
      for (uVar16 = (uint)(ushort)(*(ushort *)(pbVar24 + 3) << 8 | *(ushort *)(pbVar24 + 3) >> 8);
          0 < (int)uVar16; uVar16 = uVar16 - 1) {
        uVar7 = *(ushort *)puVar19 << 8 | *(ushort *)puVar19 >> 8;
        uVar11 = (ulong)(uint)uVar7;
        uVar18 = (uint)uVar7;
        if ((uVar18 != *backref_cache && *backref_cache <= (int)(uint)uVar7) ||
           (uVar9 = backref_cache[uVar11], (int)uVar9 < 0)) {
          pbVar20 = coda__pcre2_find_bracket_8(startcode,utf,uVar18);
          pbVar21 = pbVar20;
          if (pbVar20 == (byte *)0x0) {
            return -2;
          }
          do {
            uVar7 = *(ushort *)(pbVar21 + 1) << 8 | *(ushort *)(pbVar21 + 1) >> 8;
            pbVar1 = pbVar21 + uVar7;
            pbVar21 = pbVar21 + uVar7;
          } while (*pbVar1 == 0x78);
          uVar9 = 0;
          prVar15 = recurses;
          if ((pbVar20 < pbVar24) && (pbVar24 < pbVar21)) {
LAB_0018f5b7:
            bVar6 = true;
          }
          else {
            for (; prVar15 != (recurse_check *)0x0; prVar15 = prVar15->prev) {
              if (prVar15->group == pbVar20) goto LAB_0018f5b7;
            }
            this_recurse.prev = recurses;
            this_recurse.group = pbVar20;
            uVar9 = find_minlength(re,pbVar20,startcode,utf,&this_recurse,countptr,backref_cache);
            if ((int)uVar9 < 0) {
              return uVar9;
            }
          }
          backref_cache[uVar11] = uVar9;
          lVar14 = (long)*backref_cache;
          while (lVar14 = lVar14 + 1, lVar14 < (long)uVar11) {
            backref_cache[lVar14] = -1;
          }
          *backref_cache = uVar18;
        }
        if ((int)uVar9 < (int)local_a4) {
          local_a4 = uVar9;
        }
        if ((int)uVar9 < 1) break;
        puVar19 = puVar19 + re->name_entry_size;
      }
      lStackY_c0 = 5;
    }
    else {
      local_a4 = 0;
    }
LAB_0018fa30:
    pbVar21 = pbVar24 + lStackY_c0;
    uVar18 = 1;
    uVar16 = pbVar24[lStackY_c0] - 0x62;
    if (uVar16 < 0xc) {
      if ((0x533U >> (uVar16 & 0x1f) & 1) == 0) {
        if ((0x20cU >> (uVar16 & 0x1f) & 1) == 0) {
          uVar18 = (uint)(ushort)(*(ushort *)(pbVar21 + 1) << 8 | *(ushort *)(pbVar21 + 1) >> 8);
          pbVar21 = pbVar21 + 5;
        }
        else {
          pbVar21 = pbVar21 + 1;
        }
      }
      else {
        pbVar21 = pbVar21 + 1;
        uVar18 = 0;
      }
    }
    if (((int)local_a4 < 1) ||
       (lStackY_c0 = lVar17, uVar16 = 0xffff, uVar18 <= (uint)(0x7fffffff / (ulong)local_a4))) {
      lStackY_c0 = lVar17;
      uVar16 = uVar23 + uVar18 * local_a4;
      if ((int)(0xffff - uVar23) < (int)(uVar18 * local_a4)) {
        uVar16 = 0xffff;
      }
    }
    goto LAB_0018f2bd;
  case 0x75:
    uVar11 = (ulong)(ushort)(*(ushort *)(pbVar24 + 1) << 8 | *(ushort *)(pbVar24 + 1) >> 8);
    uVar16 = (uint)(ushort)(*(ushort *)(startcode + uVar11 + 3) << 8 |
                           *(ushort *)(startcode + uVar11 + 3) >> 8);
    if (uVar16 == local_70) {
      uVar23 = uVar23 + local_74;
    }
    else {
      pbVar20 = startcode + uVar11;
      pbVar21 = pbVar20;
      do {
        uVar7 = *(ushort *)(pbVar21 + 1) << 8 | *(ushort *)(pbVar21 + 1) >> 8;
        pbVar1 = pbVar21 + uVar7;
        pbVar21 = pbVar21 + uVar7;
      } while (*pbVar1 == 0x78);
      prVar15 = recurses;
      if ((pbVar20 < pbVar24) && (pbVar24 < pbVar21)) {
LAB_0018f8e3:
        bVar6 = true;
      }
      else {
        for (; prVar15 != (recurse_check *)0x0; prVar15 = prVar15->prev) {
          if (prVar15->group == pbVar20) goto LAB_0018f8e3;
        }
        this_recurse.prev = recurses;
        this_recurse.group = pbVar20;
        local_74 = find_minlength(re,pbVar20,startcode,utf,&this_recurse,countptr,backref_cache);
        if (local_74 < 0) {
          return local_74;
        }
        uVar23 = uVar23 + local_74;
        local_70 = uVar16;
      }
    }
    pbVar21 = pbVar24 + lVar17 + 3;
    lStackY_c0 = 0;
    uVar16 = uVar23;
    goto LAB_0018f2bd;
  case 0x77:
    pbVar21 = pbVar24 + (ushort)(*(ushort *)(pbVar24 + 5) << 8 | *(ushort *)(pbVar24 + 5) >> 8);
    goto LAB_0018f2bd;
  case 0x7f:
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x83:
  case 0x84:
    do {
      uVar7 = *(ushort *)(pbVar21 + 1) << 8 | *(ushort *)(pbVar21 + 1) >> 8;
      pbVar24 = pbVar21 + uVar7;
      pbVar20 = pbVar21 + uVar7;
      uVar11 = (ulong)*pbVar20;
      pbVar21 = pbVar24;
    } while (*pbVar20 == 0x78);
    break;
  case 0x85:
  case 0x86:
  case 0x88:
  case 0x8c:
  case 0x8d:
    goto switchD_0018f2ea_caseD_85;
  case 0x87:
    if (pbVar24[3] == 0x75) {
      pbVar21 = pbVar24 + 3;
      lStackY_c0 = 3;
      if (pbVar24[6] != 0x79) goto switchD_0018f2ea_caseD_85;
      goto LAB_0018f2bd;
    }
    goto switchD_0018f2ea_caseD_85;
  case 0x89:
  case 0x8a:
  case 0x8e:
  case 0x8f:
    uVar16 = (uint)(ushort)(*(ushort *)(pbVar24 + 3) << 8 | *(ushort *)(pbVar24 + 3) >> 8);
    if ((((uVar5 >> 0x15 & 1) != 0) || (uVar16 != local_6c)) &&
       (local_68 = find_minlength(re,pbVar24,startcode,utf,recurses,countptr,backref_cache),
       local_6c = uVar16, local_68 < 0)) {
      return local_68;
    }
    do {
      uVar7 = *(ushort *)(pbVar24 + 1) << 8 | *(ushort *)(pbVar24 + 1) >> 8;
      pbVar21 = pbVar24 + uVar7;
      pbVar24 = pbVar24 + uVar7;
    } while (*pbVar21 == 0x78);
    pbVar21 = pbVar24 + 3;
    uVar16 = uVar23 + local_68;
    goto LAB_0018f2bd;
  case 0x8b:
  case 0x90:
    uVar7 = *(ushort *)(pbVar24 + 1) << 8 | *(ushort *)(pbVar24 + 1) >> 8;
    if (pbVar24[uVar7] != 0x78) {
      pbVar24 = pbVar24 + uVar7;
      goto LAB_0018f47b;
    }
switchD_0018f2ea_caseD_85:
    iVar10 = find_minlength(re,pbVar24,startcode,utf,recurses,countptr,backref_cache);
    if (iVar10 < 0) {
      return iVar10;
    }
    do {
      uVar7 = *(ushort *)(pbVar24 + 1) << 8 | *(ushort *)(pbVar24 + 1) >> 8;
      pbVar21 = pbVar24 + uVar7;
      pbVar24 = pbVar24 + uVar7;
    } while (*pbVar21 == 0x78);
    pbVar21 = pbVar24 + 3;
    lStackY_c0 = lVar17;
    uVar16 = iVar10 + uVar23;
    goto LAB_0018f2bd;
  case 0x97:
  case 0x98:
  case 0x99:
  case 0xa7:
    pbVar24 = pbVar24 + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                        [uVar11];
    do {
      uVar7 = *(ushort *)(pbVar24 + 1) << 8 | *(ushort *)(pbVar24 + 1) >> 8;
      pbVar21 = pbVar24 + uVar7;
      pbVar24 = pbVar24 + uVar7;
    } while (*pbVar21 == 0x78);
LAB_0018f47b:
    pbVar21 = pbVar24 + 3;
    goto LAB_0018f2bd;
  case 0x9a:
  case 0x9c:
  case 0x9e:
  case 0xa0:
  case 0xa2:
    goto switchD_0018f2ea_caseD_9a;
  case 0xa4:
  case 0xa5:
    goto LAB_0018f239;
  }
  pbVar21 = pbVar24 + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                      [uVar11];
  goto LAB_0018f2bd;
switchD_0018f2ea_caseD_9a:
  pbVar21 = pbVar24 + (ulong)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                             [uVar11] + (ulong)pbVar24[1];
  goto LAB_0018f2bd;
LAB_0018f239:
  return -3;
}

Assistant:

static int
find_minlength(const pcre2_real_code *re, PCRE2_SPTR code,
  PCRE2_SPTR startcode, BOOL utf, recurse_check *recurses, int *countptr,
  int *backref_cache)
{
int length = -1;
int branchlength = 0;
int prev_cap_recno = -1;
int prev_cap_d = 0;
int prev_recurse_recno = -1;
int prev_recurse_d = 0;
uint32_t once_fudge = 0;
BOOL had_recurse = FALSE;
BOOL dupcapused = (re->flags & PCRE2_DUPCAPUSED) != 0;
PCRE2_SPTR nextbranch = code + GET(code, 1);
PCRE2_UCHAR *cc = (PCRE2_UCHAR *)code + 1 + LINK_SIZE;
recurse_check this_recurse;

/* If this is a "could be empty" group, its minimum length is 0. */

if (*code >= OP_SBRA && *code <= OP_SCOND) return 0;

/* Skip over capturing bracket number */

if (*code == OP_CBRA || *code == OP_CBRAPOS) cc += IMM2_SIZE;

/* A large and/or complex regex can take too long to process. */

if ((*countptr)++ > 1000) return -1;

/* Scan along the opcodes for this branch. If we get to the end of the branch,
check the length against that of the other branches. If the accumulated length
passes 16-bits, reset to that value and skip the rest of the branch. */

for (;;)
  {
  int d, min, recno;
  PCRE2_UCHAR op, *cs, *ce;

  if (branchlength >= UINT16_MAX)
    {
    branchlength = UINT16_MAX;
    cc = (PCRE2_UCHAR *)nextbranch;
    }

  op = *cc;
  switch (op)
    {
    case OP_COND:
    case OP_SCOND:

    /* If there is only one branch in a condition, the implied branch has zero
    length, so we don't add anything. This covers the DEFINE "condition"
    automatically. If there are two branches we can treat it the same as any
    other non-capturing subpattern. */

    cs = cc + GET(cc, 1);
    if (*cs != OP_ALT)
      {
      cc = cs + 1 + LINK_SIZE;
      break;
      }
    goto PROCESS_NON_CAPTURE;

    case OP_BRA:
    /* There's a special case of OP_BRA, when it is wrapped round a repeated
    OP_RECURSE. We'd like to process the latter at this level so that
    remembering the value works for repeated cases. So we do nothing, but
    set a fudge value to skip over the OP_KET after the recurse. */

    if (cc[1+LINK_SIZE] == OP_RECURSE && cc[2*(1+LINK_SIZE)] == OP_KET)
      {
      once_fudge = 1 + LINK_SIZE;
      cc += 1 + LINK_SIZE;
      break;
      }
    /* Fall through */

    case OP_ONCE:
    case OP_SCRIPT_RUN:
    case OP_SBRA:
    case OP_BRAPOS:
    case OP_SBRAPOS:
    PROCESS_NON_CAPTURE:
    d = find_minlength(re, cc, startcode, utf, recurses, countptr,
      backref_cache);
    if (d < 0) return d;
    branchlength += d;
    do cc += GET(cc, 1); while (*cc == OP_ALT);
    cc += 1 + LINK_SIZE;
    break;

    /* To save time for repeated capturing subpatterns, we remember the
    length of the previous one. Unfortunately we can't do the same for
    the unnumbered ones above. Nor can we do this if (?| is present in the
    pattern because captures with the same number are not then identical. */

    case OP_CBRA:
    case OP_SCBRA:
    case OP_CBRAPOS:
    case OP_SCBRAPOS:
    recno = (int)GET2(cc, 1+LINK_SIZE);
    if (dupcapused || recno != prev_cap_recno)
      {
      prev_cap_recno = recno;
      prev_cap_d = find_minlength(re, cc, startcode, utf, recurses, countptr,
        backref_cache);
      if (prev_cap_d < 0) return prev_cap_d;
      }
    branchlength += prev_cap_d;
    do cc += GET(cc, 1); while (*cc == OP_ALT);
    cc += 1 + LINK_SIZE;
    break;

    /* ACCEPT makes things far too complicated; we have to give up. In fact,
    from 10.34 onwards, if a pattern contains (*ACCEPT), this function is not
    used. However, leave the code in place, just in case. */

    case OP_ACCEPT:
    case OP_ASSERT_ACCEPT:
    return -1;

    /* Reached end of a branch; if it's a ket it is the end of a nested
    call. If it's ALT it is an alternation in a nested call. If it is END it's
    the end of the outer call. All can be handled by the same code. If the
    length of any branch is zero, there is no need to scan any subsequent
    branches. */

    case OP_ALT:
    case OP_KET:
    case OP_KETRMAX:
    case OP_KETRMIN:
    case OP_KETRPOS:
    case OP_END:
    if (length < 0 || (!had_recurse && branchlength < length))
      length = branchlength;
    if (op != OP_ALT || length == 0) return length;
    nextbranch = cc + GET(cc, 1);
    cc += 1 + LINK_SIZE;
    branchlength = 0;
    had_recurse = FALSE;
    break;

    /* Skip over assertive subpatterns */

    case OP_ASSERT:
    case OP_ASSERT_NOT:
    case OP_ASSERTBACK:
    case OP_ASSERTBACK_NOT:
    case OP_ASSERT_NA:
    case OP_ASSERTBACK_NA:
    do cc += GET(cc, 1); while (*cc == OP_ALT);
    /* Fall through */

    /* Skip over things that don't match chars */

    case OP_REVERSE:
    case OP_VREVERSE:
    case OP_CREF:
    case OP_DNCREF:
    case OP_RREF:
    case OP_DNRREF:
    case OP_FALSE:
    case OP_TRUE:
    case OP_CALLOUT:
    case OP_SOD:
    case OP_SOM:
    case OP_EOD:
    case OP_EODN:
    case OP_CIRC:
    case OP_CIRCM:
    case OP_DOLL:
    case OP_DOLLM:
    case OP_NOT_WORD_BOUNDARY:
    case OP_WORD_BOUNDARY:
    case OP_NOT_UCP_WORD_BOUNDARY:
    case OP_UCP_WORD_BOUNDARY:
    cc += PRIV(OP_lengths)[*cc];
    break;

    case OP_CALLOUT_STR:
    cc += GET(cc, 1 + 2*LINK_SIZE);
    break;

    /* Skip over a subpattern that has a {0} or {0,x} quantifier */

    case OP_BRAZERO:
    case OP_BRAMINZERO:
    case OP_BRAPOSZERO:
    case OP_SKIPZERO:
    cc += PRIV(OP_lengths)[*cc];
    do cc += GET(cc, 1); while (*cc == OP_ALT);
    cc += 1 + LINK_SIZE;
    break;

    /* Handle literal characters and + repetitions */

    case OP_CHAR:
    case OP_CHARI:
    case OP_NOT:
    case OP_NOTI:
    case OP_PLUS:
    case OP_PLUSI:
    case OP_MINPLUS:
    case OP_MINPLUSI:
    case OP_POSPLUS:
    case OP_POSPLUSI:
    case OP_NOTPLUS:
    case OP_NOTPLUSI:
    case OP_NOTMINPLUS:
    case OP_NOTMINPLUSI:
    case OP_NOTPOSPLUS:
    case OP_NOTPOSPLUSI:
    branchlength++;
    cc += 2;
#ifdef SUPPORT_UNICODE
    if (utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    case OP_TYPEPLUS:
    case OP_TYPEMINPLUS:
    case OP_TYPEPOSPLUS:
    branchlength++;
    cc += (cc[1] == OP_PROP || cc[1] == OP_NOTPROP)? 4 : 2;
    break;

    /* Handle exact repetitions. The count is already in characters, but we
    may need to skip over a multibyte character in UTF mode.  */

    case OP_EXACT:
    case OP_EXACTI:
    case OP_NOTEXACT:
    case OP_NOTEXACTI:
    branchlength += GET2(cc,1);
    cc += 2 + IMM2_SIZE;
#ifdef SUPPORT_UNICODE
    if (utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    case OP_TYPEEXACT:
    branchlength += GET2(cc,1);
    cc += 2 + IMM2_SIZE + ((cc[1 + IMM2_SIZE] == OP_PROP
      || cc[1 + IMM2_SIZE] == OP_NOTPROP)? 2 : 0);
    break;

    /* Handle single-char non-literal matchers */

    case OP_PROP:
    case OP_NOTPROP:
    cc += 2;
    /* Fall through */

    case OP_NOT_DIGIT:
    case OP_DIGIT:
    case OP_NOT_WHITESPACE:
    case OP_WHITESPACE:
    case OP_NOT_WORDCHAR:
    case OP_WORDCHAR:
    case OP_ANY:
    case OP_ALLANY:
    case OP_EXTUNI:
    case OP_HSPACE:
    case OP_NOT_HSPACE:
    case OP_VSPACE:
    case OP_NOT_VSPACE:
    branchlength++;
    cc++;
    break;

    /* "Any newline" might match two characters, but it also might match just
    one. */

    case OP_ANYNL:
    branchlength += 1;
    cc++;
    break;

    /* The single-byte matcher means we can't proceed in UTF mode. (In
    non-UTF mode \C will actually be turned into OP_ALLANY, so won't ever
    appear, but leave the code, just in case.) */

    case OP_ANYBYTE:
#ifdef SUPPORT_UNICODE
    if (utf) return -1;
#endif
    branchlength++;
    cc++;
    break;

    /* For repeated character types, we have to test for \p and \P, which have
    an extra two bytes of parameters. */

    case OP_TYPESTAR:
    case OP_TYPEMINSTAR:
    case OP_TYPEQUERY:
    case OP_TYPEMINQUERY:
    case OP_TYPEPOSSTAR:
    case OP_TYPEPOSQUERY:
    if (cc[1] == OP_PROP || cc[1] == OP_NOTPROP) cc += 2;
    cc += PRIV(OP_lengths)[op];
    break;

    case OP_TYPEUPTO:
    case OP_TYPEMINUPTO:
    case OP_TYPEPOSUPTO:
    if (cc[1 + IMM2_SIZE] == OP_PROP
      || cc[1 + IMM2_SIZE] == OP_NOTPROP) cc += 2;
    cc += PRIV(OP_lengths)[op];
    break;

    /* Check a class for variable quantification */

    case OP_CLASS:
    case OP_NCLASS:
#ifdef SUPPORT_WIDE_CHARS
    case OP_XCLASS:
    /* The original code caused an unsigned overflow in 64 bit systems,
    so now we use a conditional statement. */
    if (op == OP_XCLASS)
      cc += GET(cc, 1);
    else
      cc += PRIV(OP_lengths)[OP_CLASS];
#else
    cc += PRIV(OP_lengths)[OP_CLASS];
#endif

    switch (*cc)
      {
      case OP_CRPLUS:
      case OP_CRMINPLUS:
      case OP_CRPOSPLUS:
      branchlength++;
      /* Fall through */

      case OP_CRSTAR:
      case OP_CRMINSTAR:
      case OP_CRQUERY:
      case OP_CRMINQUERY:
      case OP_CRPOSSTAR:
      case OP_CRPOSQUERY:
      cc++;
      break;

      case OP_CRRANGE:
      case OP_CRMINRANGE:
      case OP_CRPOSRANGE:
      branchlength += GET2(cc,1);
      cc += 1 + 2 * IMM2_SIZE;
      break;

      default:
      branchlength++;
      break;
      }
    break;

    /* Backreferences and subroutine calls (OP_RECURSE) are treated in the same
    way: we find the minimum length for the subpattern. A recursion
    (backreference or subroutine) causes an a flag to be set that causes the
    length of this branch to be ignored. The logic is that a recursion can only
    make sense if there is another alternative that stops the recursing. That
    will provide the minimum length (when no recursion happens).

    If PCRE2_MATCH_UNSET_BACKREF is set, a backreference to an unset bracket
    matches an empty string (by default it causes a matching failure), so in
    that case we must set the minimum length to zero.

    For backreferenes, if duplicate numbers are present in the pattern we check
    for a reference to a duplicate. If it is, we don't know which version will
    be referenced, so we have to set the minimum length to zero. */

    /* Duplicate named pattern back reference. */

    case OP_DNREF:
    case OP_DNREFI:
    if (!dupcapused && (re->overall_options & PCRE2_MATCH_UNSET_BACKREF) == 0)
      {
      int count = GET2(cc, 1+IMM2_SIZE);
      PCRE2_UCHAR *slot =
        (PCRE2_UCHAR *)((uint8_t *)re + sizeof(pcre2_real_code)) +
          GET2(cc, 1) * re->name_entry_size;

      d = INT_MAX;

      /* Scan all groups with the same name; find the shortest. */

      while (count-- > 0)
        {
        int dd, i;
        recno = GET2(slot, 0);

        if (recno <= backref_cache[0] && backref_cache[recno] >= 0)
          dd = backref_cache[recno];
        else
          {
          ce = cs = (PCRE2_UCHAR *)PRIV(find_bracket)(startcode, utf, recno);
          if (cs == NULL) return -2;
          do ce += GET(ce, 1); while (*ce == OP_ALT);

          dd = 0;
          if (!dupcapused ||
              (PCRE2_UCHAR *)PRIV(find_bracket)(ce, utf, recno) == NULL)
            {
            if (cc > cs && cc < ce)    /* Simple recursion */
              {
              had_recurse = TRUE;
              }
            else
              {
              recurse_check *r = recurses;
              for (r = recurses; r != NULL; r = r->prev)
                if (r->group == cs) break;
              if (r != NULL)           /* Mutual recursion */
                {
                had_recurse = TRUE;
                }
              else
                {
                this_recurse.prev = recurses;  /* No recursion */
                this_recurse.group = cs;
                dd = find_minlength(re, cs, startcode, utf, &this_recurse,
                  countptr, backref_cache);
                if (dd < 0) return dd;
                }
              }
            }

          backref_cache[recno] = dd;
          for (i = backref_cache[0] + 1; i < recno; i++) backref_cache[i] = -1;
          backref_cache[0] = recno;
          }

        if (dd < d) d = dd;
        if (d <= 0) break;    /* No point looking at any more */
        slot += re->name_entry_size;
        }
      }
    else d = 0;
    cc += 1 + 2*IMM2_SIZE;
    goto REPEAT_BACK_REFERENCE;

    /* Single back reference by number. References by name are converted to by
    number when there is no duplication. */

    case OP_REF:
    case OP_REFI:
    recno = GET2(cc, 1);
    if (recno <= backref_cache[0] && backref_cache[recno] >= 0)
      d = backref_cache[recno];
    else
      {
      int i;
      d = 0;

      if ((re->overall_options & PCRE2_MATCH_UNSET_BACKREF) == 0)
        {
        ce = cs = (PCRE2_UCHAR *)PRIV(find_bracket)(startcode, utf, recno);
        if (cs == NULL) return -2;
        do ce += GET(ce, 1); while (*ce == OP_ALT);

        if (!dupcapused ||
            (PCRE2_UCHAR *)PRIV(find_bracket)(ce, utf, recno) == NULL)
          {
          if (cc > cs && cc < ce)    /* Simple recursion */
            {
            had_recurse = TRUE;
            }
          else
            {
            recurse_check *r = recurses;
            for (r = recurses; r != NULL; r = r->prev) if (r->group == cs) break;
            if (r != NULL)           /* Mutual recursion */
              {
              had_recurse = TRUE;
              }
            else                     /* No recursion */
              {
              this_recurse.prev = recurses;
              this_recurse.group = cs;
              d = find_minlength(re, cs, startcode, utf, &this_recurse, countptr,
                backref_cache);
              if (d < 0) return d;
              }
            }
          }
        }

      backref_cache[recno] = d;
      for (i = backref_cache[0] + 1; i < recno; i++) backref_cache[i] = -1;
      backref_cache[0] = recno;
      }

    cc += 1 + IMM2_SIZE;

    /* Handle repeated back references */

    REPEAT_BACK_REFERENCE:
    switch (*cc)
      {
      case OP_CRSTAR:
      case OP_CRMINSTAR:
      case OP_CRQUERY:
      case OP_CRMINQUERY:
      case OP_CRPOSSTAR:
      case OP_CRPOSQUERY:
      min = 0;
      cc++;
      break;

      case OP_CRPLUS:
      case OP_CRMINPLUS:
      case OP_CRPOSPLUS:
      min = 1;
      cc++;
      break;

      case OP_CRRANGE:
      case OP_CRMINRANGE:
      case OP_CRPOSRANGE:
      min = GET2(cc, 1);
      cc += 1 + 2 * IMM2_SIZE;
      break;

      default:
      min = 1;
      break;
      }

     /* Take care not to overflow: (1) min and d are ints, so check that their
     product is not greater than INT_MAX. (2) branchlength is limited to
     UINT16_MAX (checked at the top of the loop). */

    if ((d > 0 && (INT_MAX/d) < min) || UINT16_MAX - branchlength < min*d)
      branchlength = UINT16_MAX;
    else branchlength += min * d;
    break;

    /* Recursion always refers to the first occurrence of a subpattern with a
    given number. Therefore, we can always make use of caching, even when the
    pattern contains multiple subpatterns with the same number. */

    case OP_RECURSE:
    cs = ce = (PCRE2_UCHAR *)startcode + GET(cc, 1);
    recno = GET2(cs, 1+LINK_SIZE);
    if (recno == prev_recurse_recno)
      {
      branchlength += prev_recurse_d;
      }
    else
      {
      do ce += GET(ce, 1); while (*ce == OP_ALT);
      if (cc > cs && cc < ce)    /* Simple recursion */
        had_recurse = TRUE;
      else
        {
        recurse_check *r = recurses;
        for (r = recurses; r != NULL; r = r->prev) if (r->group == cs) break;
        if (r != NULL)          /* Mutual recursion */
          had_recurse = TRUE;
        else
          {
          this_recurse.prev = recurses;
          this_recurse.group = cs;
          prev_recurse_d = find_minlength(re, cs, startcode, utf, &this_recurse,
            countptr, backref_cache);
          if (prev_recurse_d < 0) return prev_recurse_d;
          prev_recurse_recno = recno;
          branchlength += prev_recurse_d;
          }
        }
      }
    cc += 1 + LINK_SIZE + once_fudge;
    once_fudge = 0;
    break;

    /* Anything else does not or need not match a character. We can get the
    item's length from the table, but for those that can match zero occurrences
    of a character, we must take special action for UTF-8 characters. As it
    happens, the "NOT" versions of these opcodes are used at present only for
    ASCII characters, so they could be omitted from this list. However, in
    future that may change, so we include them here so as not to leave a
    gotcha for a future maintainer. */

    case OP_UPTO:
    case OP_UPTOI:
    case OP_NOTUPTO:
    case OP_NOTUPTOI:
    case OP_MINUPTO:
    case OP_MINUPTOI:
    case OP_NOTMINUPTO:
    case OP_NOTMINUPTOI:
    case OP_POSUPTO:
    case OP_POSUPTOI:
    case OP_NOTPOSUPTO:
    case OP_NOTPOSUPTOI:

    case OP_STAR:
    case OP_STARI:
    case OP_NOTSTAR:
    case OP_NOTSTARI:
    case OP_MINSTAR:
    case OP_MINSTARI:
    case OP_NOTMINSTAR:
    case OP_NOTMINSTARI:
    case OP_POSSTAR:
    case OP_POSSTARI:
    case OP_NOTPOSSTAR:
    case OP_NOTPOSSTARI:

    case OP_QUERY:
    case OP_QUERYI:
    case OP_NOTQUERY:
    case OP_NOTQUERYI:
    case OP_MINQUERY:
    case OP_MINQUERYI:
    case OP_NOTMINQUERY:
    case OP_NOTMINQUERYI:
    case OP_POSQUERY:
    case OP_POSQUERYI:
    case OP_NOTPOSQUERY:
    case OP_NOTPOSQUERYI:

    cc += PRIV(OP_lengths)[op];
#ifdef SUPPORT_UNICODE
    if (utf && HAS_EXTRALEN(cc[-1])) cc += GET_EXTRALEN(cc[-1]);
#endif
    break;

    /* Skip these, but we need to add in the name length. */

    case OP_MARK:
    case OP_COMMIT_ARG:
    case OP_PRUNE_ARG:
    case OP_SKIP_ARG:
    case OP_THEN_ARG:
    cc += PRIV(OP_lengths)[op] + cc[1];
    break;

    /* The remaining opcodes are just skipped over. */

    case OP_CLOSE:
    case OP_COMMIT:
    case OP_FAIL:
    case OP_PRUNE:
    case OP_SET_SOM:
    case OP_SKIP:
    case OP_THEN:
    cc += PRIV(OP_lengths)[op];
    break;

    /* This should not occur: we list all opcodes explicitly so that when
    new ones get added they are properly considered. */

    default:
    return -3;
    }
  }
/* Control never gets here */
}